

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O2

ssize_t trp_ly_out_clb_func(void *user_data,void *buf,size_t count)

{
  LY_ERR LVar1;
  
  if (*user_data == 0) {
    LVar1 = ly_write_(*(ly_out **)((long)user_data + 8),(char *)buf,count);
    if (LVar1 != LY_SUCCESS) {
      *(LY_ERR *)((long)user_data + 0x18) = LVar1;
      count = 0xffffffffffffffff;
    }
  }
  else if (*user_data == 1) {
    *(long *)((long)user_data + 0x10) = *(long *)((long)user_data + 0x10) + count;
  }
  return count;
}

Assistant:

static ssize_t
trp_ly_out_clb_func(void *user_data, const void *buf, size_t count)
{
    LY_ERR erc = LY_SUCCESS;
    struct ly_out_clb_arg *data = (struct ly_out_clb_arg *)user_data;

    switch (data->mode) {
    case TRD_PRINT:
        erc = ly_write_(data->out, buf, count);
        break;
    case TRD_CHAR_COUNT:
        data->counter = data->counter + count;
        break;
    default:
        break;
    }

    if (erc != LY_SUCCESS) {
        data->last_error = erc;
        return -1;
    } else {
        return count;
    }
}